

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

char * re2::TerminateNumber(char *buf,int nbuf,char *str,int *np,bool accept_spaces)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  
  uVar3 = (ulong)*np;
  pcVar5 = "";
  if ((long)uVar3 < 1) {
    return pcVar5;
  }
  iVar1 = isspace((int)*str);
  if (iVar1 != 0) {
    if (!accept_spaces) {
      return pcVar5;
    }
    pcVar4 = str + uVar3;
    do {
      iVar1 = isspace((int)*str);
      if (iVar1 == 0) goto LAB_0012b8d9;
      iVar1 = (int)uVar3;
      str = str + 1;
      uVar3 = (ulong)(iVar1 - 1);
    } while (1 < iVar1);
    uVar3 = 0;
    str = pcVar4;
  }
LAB_0012b8d9:
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  else if (*str == '-') {
    uVar3 = (ulong)((int)uVar3 - 1);
    str = str + 1;
    uVar2 = 1;
    goto LAB_0012b8f1;
  }
  uVar2 = 0;
LAB_0012b8f1:
  if (((2 < (int)uVar3) && (*str == '0')) && (str[1] == '0')) {
    pcVar4 = str + (ulong)((int)uVar3 - 3) + 1;
    do {
      if (str[2] != '0') goto LAB_0012b92c;
      iVar1 = (int)uVar3;
      str = str + 1;
      uVar3 = (ulong)(iVar1 - 1);
    } while (3 < iVar1);
    uVar3 = 2;
    str = pcVar4;
  }
LAB_0012b92c:
  __n = (uVar3 & 0xffffffff) + (ulong)uVar2;
  if ((int)__n < nbuf) {
    memmove(buf,str + -(ulong)uVar2,__n);
    if ((char)uVar2 != '\0') {
      *buf = '-';
    }
    buf[__n] = '\0';
    *np = (int)__n;
    pcVar5 = buf;
  }
  return pcVar5;
}

Assistant:

static const char* TerminateNumber(char* buf, int nbuf, const char* str, int* np,
                                   bool accept_spaces) {
  int n = *np;
  if (n <= 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}